

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2double(double *val,char *str)

{
  char *pcVar1;
  size_t sVar2;
  double dVar3;
  double num;
  char *endptr;
  char *str_local;
  double *val_local;
  
  if (((str == (char *)0x0) ||
      (endptr = str, str_local = (char *)val, dVar3 = strtod(str,(char **)&num), pcVar1 = endptr,
      (char *)num == endptr)) || (sVar2 = strlen(endptr), (char *)num != pcVar1 + sVar2)) {
    val_local._4_4_ = PARAM_BAD_NUMERIC;
  }
  else {
    *(double *)str_local = dVar3;
    val_local._4_4_ = PARAM_OK;
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2double(double *val, const char *str)
{
  if(str) {
    char *endptr;
    double num = strtod(str, &endptr);
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}